

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O0

uint prvTidygetArgValueUInt(TidyMessageImpl message,TidyMessageArgument *arg)

{
  int iVar1;
  int argNum;
  TidyMessageArgument *arg_local;
  
  iVar1 = (int)*arg + -1;
  if (message.argcount < iVar1) {
    __assert_fail("argNum <= message.argcount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/messageobj.c"
                  ,0x1c7,"uint prvTidygetArgValueUInt(TidyMessageImpl, TidyMessageArgument *)");
  }
  if (message.arguments[iVar1].type == tidyFormatType_UINT) {
    return message.arguments[iVar1].u.ui;
  }
  __assert_fail("message.arguments[argNum].type == tidyFormatType_UINT",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/messageobj.c"
                ,0x1c8,"uint prvTidygetArgValueUInt(TidyMessageImpl, TidyMessageArgument *)");
}

Assistant:

uint TY_(getArgValueUInt)( TidyMessageImpl message, TidyMessageArgument* arg )
{
    int argNum = (int)(size_t)*arg - 1;
    assert( argNum <= message.argcount );
    assert( message.arguments[argNum].type == tidyFormatType_UINT);

    return message.arguments[argNum].u.ui;
}